

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

jieba_words_t * jieba_cut_small(jieba_t *handle,char *sentence,size_t max_word_len)

{
  jieba_words_t *pjVar1;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  size_t in_stack_ffffffffffffff78;
  Jieba *this;
  undefined1 local_51 [65];
  string *local_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14ebf3);
  this = (Jieba *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_51 + 1),(char *)local_10,(allocator *)this);
  cppjieba::Jieba::CutSmall(this,local_10,local_8,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  pjVar1 = convert_words((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return pjVar1;
}

Assistant:

jieba_words_t* jieba_cut_small(jieba_t* handle, const char* sentence, size_t max_word_len) {
  std::vector<std::string> words;
  ((cppjieba::Jieba*)handle)->CutSmall(sentence, words, max_word_len);
  return convert_words(words);
}